

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

ImVec2 __thiscall BoardView::ScreenToCoord(BoardView *this,float x,float y,float w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  iVar5 = this->m_rotation;
  fVar9 = x;
  fVar7 = y;
  if (iVar5 != 0) {
    if (iVar5 == 2) {
      fVar9 = -x;
      fVar7 = -y;
    }
    else if (iVar5 == 1) {
      fVar7 = -x;
      fVar9 = y;
    }
    else {
      fVar9 = -y;
      fVar7 = x;
    }
  }
  fVar8 = 1.0 / this->m_scale;
  if (this->m_current_side != 0) {
    fVar9 = -fVar9;
  }
  uVar1 = this->m_dx;
  uVar3 = this->m_dy;
  uVar2 = this->m_mx;
  uVar4 = this->m_my;
  IVar6.y = fVar8 * -fVar7 + w * ((float)uVar4 - (float)uVar3);
  IVar6.x = fVar8 * fVar9 + w * ((float)uVar2 - (float)uVar1);
  return IVar6;
}

Assistant:

ImVec2 BoardView::ScreenToCoord(float x, float y, float w) {
	float tx, ty;

	switch (m_rotation) {
		case 0:
			tx = x;
			ty = y;
			break;
		case 1:
			tx = y;
			ty = -x;
			break;
		case 2:
			tx = -x;
			ty = -y;
			break;
		default:
			tx = -y;
			ty = x;
			break;
	}
	float side     = m_current_side ? -1.0f : 1.0f;
	float invscale = 1.0f / m_scale;

	tx = tx * side * invscale + w * (m_mx - m_dx);
	ty = ty * -1.0f * invscale + w * (m_my - m_dy);

	return ImVec2(tx, ty);
}